

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void parse(ch_compilation *comp,ch_precedence_level prec)

{
  advance(comp);
  if (rules[(comp->previous).kind].prefix_parse != (ch_parse_func)0x0) {
    (*rules[(comp->previous).kind].prefix_parse)(comp);
    while (prec <= rules[(comp->current).kind].prec) {
      advance(comp);
      (*rules[(comp->previous).kind].infix_parse)(comp);
    }
    return;
  }
  error(comp,"Expected expression");
  return;
}

Assistant:

void parse(ch_compilation *comp, ch_precedence_level prec) {
  advance(comp);
  ch_parse_func prefix = get_rule(comp->previous.kind)->prefix_parse;
  if (!prefix) {
    error(comp, "Expected expression");
    return;
  }

  prefix(comp);

  while (prec <= get_rule(comp->current.kind)->prec) {
    advance(comp);
    ch_parse_func infix = get_rule(comp->previous.kind)->infix_parse;
    infix(comp);
  }
}